

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

UBool isWhitespace(UChar32 c)

{
  if (c < 0x20) {
    if (c != 9) {
      if (c == 10) goto LAB_002131af;
      if (c != 0xd) {
        return '\0';
      }
    }
  }
  else if ((c != 0x20) && (c != 0xfeff)) {
    if (c != 0x2029) {
      return '\0';
    }
LAB_002131af:
    lineCount = lineCount + 1;
    return '\x01';
  }
  return '\x01';
}

Assistant:

static UBool isWhitespace(UChar32 c) {
    switch (c) {
        /* ' ', '\t', '\n', '\r', 0x2029, 0xFEFF */
    case 0x000A:
    case 0x2029:
        lineCount++;
    case 0x000D:
    case 0x0020:
    case 0x0009:
    case 0xFEFF:
        return TRUE;

    default:
        return FALSE;
    }
}